

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::PolyOffsetBuilder::DoRound(PolyOffsetBuilder *this)

{
  size_t sVar1;
  pointer pvVar2;
  pointer pDVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  double a2;
  double dVar8;
  Polygon arc;
  IntPoint pt2;
  IntPoint pt1;
  Polygon local_50;
  IntPoint local_38;
  IntPoint local_28;
  
  sVar1 = this->m_j;
  pvVar2 = (this->m_p).
           super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar3 = (this->normals).
           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar5 = *(long *)&pvVar2[this->m_i].
                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                    _M_impl;
  lVar4 = sVar1 * 0x10;
  dVar7 = this->m_delta;
  dVar8 = pDVar3[this->m_k].X * dVar7 + (double)*(long *)(lVar5 + lVar4);
  uVar6 = -(ulong)(dVar8 < 0.0);
  local_28.X = (long64)((double)(~uVar6 & 0x3fe0000000000000 | uVar6 & 0xbfe0000000000000) + dVar8);
  dVar8 = pDVar3[this->m_k].Y * dVar7 + (double)*(long *)(lVar5 + 8 + lVar4);
  uVar6 = -(ulong)(dVar8 < 0.0);
  local_28.Y = (long64)((double)(~uVar6 & 0x3fe0000000000000 | uVar6 & 0xbfe0000000000000) + dVar8);
  lVar5 = *(long *)&pvVar2[this->m_i].
                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                    _M_impl;
  dVar8 = pDVar3[sVar1].X * dVar7 + (double)*(long *)(lVar5 + lVar4);
  uVar6 = -(ulong)(dVar8 < 0.0);
  local_38.X = (long64)((double)(~uVar6 & 0x3fe0000000000000 | uVar6 & 0xbfe0000000000000) + dVar8);
  dVar7 = dVar7 * pDVar3[sVar1].Y + (double)*(long *)(lVar5 + 8 + lVar4);
  uVar6 = -(ulong)(dVar7 < 0.0);
  local_38.Y = (long64)((double)(~uVar6 & 0x3fe0000000000000 | uVar6 & 0xbfe0000000000000) + dVar7);
  AddPoint(this,&local_28);
  pDVar3 = (this->normals).
           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  sVar1 = this->m_j;
  dVar7 = pDVar3[this->m_k].X;
  dVar8 = pDVar3[this->m_k].Y;
  if (0.0 <= (dVar7 * pDVar3[sVar1].Y - dVar8 * pDVar3[sVar1].X) * this->m_delta) {
    if (pDVar3[sVar1].X * dVar7 + pDVar3[sVar1].Y * dVar8 < 0.985) {
      dVar8 = atan2(dVar8,dVar7);
      pDVar3 = (this->normals).
               super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
               ._M_impl.super__Vector_impl_data._M_start;
      a2 = atan2(pDVar3[this->m_j].Y,pDVar3[this->m_j].X);
      dVar7 = this->m_delta;
      if ((dVar7 <= 0.0) || (dVar8 <= a2)) {
        if ((dVar7 < 0.0) && (dVar8 < a2)) {
          a2 = a2 + -6.283185307179586;
        }
      }
      else {
        a2 = a2 + 6.283185307179586;
      }
      BuildArc(&local_50,
               (IntPoint *)
               (this->m_j * 0x10 +
               *(long *)&(this->m_p).
                         super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[this->m_i].
                         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                         ._M_impl),dVar8,a2,dVar7);
      if (local_50.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_50.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        lVar5 = 0;
        uVar6 = 0;
        do {
          AddPoint(this,(IntPoint *)
                        ((long)&(local_50.
                                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->X + lVar5));
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + 0x10;
        } while (uVar6 < (ulong)((long)local_50.
                                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_50.
                                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      if (local_50.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.
                        super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_50.
                              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.
                              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  else {
    AddPoint(this,(IntPoint *)
                  (sVar1 * 0x10 +
                  *(long *)&(this->m_p).
                            super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[this->m_i].
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl));
  }
  AddPoint(this,&local_38);
  return;
}

Assistant:

void DoRound()
{
    IntPoint pt1 = IntPoint((long64)Round(m_p[m_i][m_j].X + normals[m_k].X * m_delta),
        (long64)Round(m_p[m_i][m_j].Y + normals[m_k].Y * m_delta));
    IntPoint pt2 = IntPoint((long64)Round(m_p[m_i][m_j].X + normals[m_j].X * m_delta),
        (long64)Round(m_p[m_i][m_j].Y + normals[m_j].Y * m_delta));
    AddPoint(pt1);
    //round off reflex angles (ie > 180 deg) unless almost flat (ie < ~10deg).
    if ((normals[m_k].X*normals[m_j].Y - normals[m_j].X*normals[m_k].Y) * m_delta >= 0)
    {
      if (normals[m_j].X * normals[m_k].X + normals[m_j].Y * normals[m_k].Y < 0.985)
      {
        double a1 = std::atan2(normals[m_k].Y, normals[m_k].X);
        double a2 = std::atan2(normals[m_j].Y, normals[m_j].X);
        if (m_delta > 0 && a2 < a1) a2 += pi *2;
        else if (m_delta < 0 && a2 > a1) a2 -= pi *2;
        Polygon arc = BuildArc(m_p[m_i][m_j], a1, a2, m_delta);
        for (Polygon::size_type m = 0; m < arc.size(); m++)
          AddPoint(arc[m]);
      }
    }
    else
      AddPoint(m_p[m_i][m_j]);
    AddPoint(pt2);
}